

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::encode_truncated_binary(symbol_codec *this,uint v,uint n)

{
  uint num_bits;
  uint uVar1;
  uint u;
  uint k;
  uint n_local;
  uint v_local;
  symbol_codec *this_local;
  
  num_bits = math::floor_log2i(n);
  uVar1 = (1 << ((char)num_bits + 1U & 0x1f)) - n;
  if (v < uVar1) {
    encode_bits(this,v,num_bits);
  }
  else {
    encode_bits(this,v + uVar1,num_bits + 1);
  }
  return;
}

Assistant:

void symbol_codec::encode_truncated_binary(uint v, uint n) {
  CRNLIB_ASSERT((n >= 2) && (v < n));

  uint k = math::floor_log2i(n);
  uint u = (1 << (k + 1)) - n;

  if (v < u)
    encode_bits(v, k);
  else
    encode_bits(v + u, k + 1);
}